

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ack_message_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::AckMessageTest_TestEqualsSimilar_Test::TestBody
          (AckMessageTest_TestEqualsSimilar_Test *this)

{
  char *pcVar1;
  AssertHelper local_68;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  hash<bidfx_public_api::price::pixie::AckMessage> local_52;
  hash<bidfx_public_api::price::pixie::AckMessage> local_51;
  AssertionResult gtest_ar;
  AckMessage newMessage;
  
  bidfx_public_api::price::pixie::AckMessage::AckMessage
            (&newMessage,0x12d687,0x1497bc5cce8,0x1497bc5cdb0,0x1497bc5cdb1,0x29a);
  testing::internal::
  CmpHelperEQ<bidfx_public_api::price::pixie::AckMessage,bidfx_public_api::price::pixie::AckMessage>
            ((internal *)&gtest_ar,"ackMessage","newMessage",(AckMessage *)ackMessage,&newMessage);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/ack_message_test.cpp"
               ,0x40,pcVar1);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_60.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::hash<bidfx_public_api::price::pixie::AckMessage>::operator()
                 (&local_51,(AckMessage *)ackMessage);
  local_68.data_ =
       (AssertHelperData *)
       std::hash<bidfx_public_api::price::pixie::AckMessage>::operator()(&local_52,&newMessage);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"std::hash<AckMessage>()(ackMessage)",
             "std::hash<AckMessage>()(newMessage)",(unsigned_long *)&local_60,
             (unsigned_long *)&local_68);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/ack_message_test.cpp"
               ,0x41,pcVar1);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(AckMessageTest, TestEqualsSimilar)
{
    AckMessage newMessage = AckMessage(1234567, 1415120801000L, 1415120801200L, 1415120801201L, 666L);
    EXPECT_EQ(ackMessage, newMessage);
    EXPECT_EQ(std::hash<AckMessage>()(ackMessage), std::hash<AckMessage>()(newMessage));
}